

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass_manager.cpp
# Opt level: O0

Status __thiscall spvtools::opt::PassManager::Run(PassManager *this,IRContext *context)

{
  ostream *out;
  bool bVar1;
  int iVar2;
  uint32_t bound;
  pointer pPVar3;
  undefined4 extraout_var;
  MessageConsumer *pMVar4;
  uint *binary_00;
  size_type binary_size;
  undefined4 extraout_var_00;
  char *__args_3;
  Module *pMVar5;
  Module *this_00;
  char *local_110;
  undefined1 local_f8 [8];
  spv_position_t null_pos;
  string local_d8 [8];
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  SpirvTools local_80;
  SpirvTools tools;
  undefined1 local_70 [4];
  Status one_status;
  ScopedTimer<spvtools::utils::Timer> timer__LINE__;
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *pass;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  *__range2;
  anon_class_16_2_5d5469c6 print_disassembly;
  undefined1 auStack_20 [4];
  Status status;
  IRContext *context_local;
  PassManager *this_local;
  
  print_disassembly.this._4_4_ = SuccessWithoutChange;
  __range2 = (vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
              *)auStack_20;
  print_disassembly.context = (IRContext **)this;
  _auStack_20 = context;
  context_local = (IRContext *)this;
  utils::PrintTimerDescription(this->time_report_stream_,true);
  __end2 = std::
           vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ::begin(&this->passes_);
  pass = (unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *)
         std::
         vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
         ::end(&this->passes_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>_>
                                *)&pass);
    if (!bVar1) {
      Run::anon_class_16_2_5d5469c6::operator()
                ((anon_class_16_2_5d5469c6 *)&__range2,"; IR after last pass",(Pass *)0x0);
      if (print_disassembly.this._4_4_ == SuccessWithChange) {
        pMVar5 = IRContext::module(_auStack_20);
        this_00 = IRContext::module(_auStack_20);
        bound = Module::ComputeIdBound(this_00);
        Module::SetIdBound(pMVar5,bound);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
      ::clear(&this->passes_);
      return print_disassembly.this._4_4_;
    }
    timer__LINE__.tag_ =
         (char *)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>_>
                 ::operator*(&__end2);
    pPVar3 = std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::get
                       ((unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                         *)timer__LINE__.tag_);
    Run::anon_class_16_2_5d5469c6::operator()
              ((anon_class_16_2_5d5469c6 *)&__range2,"; IR before pass ",pPVar3);
    out = this->time_report_stream_;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)timer__LINE__.tag_);
    if (bVar1) {
      pPVar3 = std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::
               operator->((unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                           *)timer__LINE__.tag_);
      iVar2 = (*pPVar3->_vptr_Pass[2])();
      local_110 = (char *)CONCAT44(extraout_var,iVar2);
    }
    else {
      local_110 = "";
    }
    utils::ScopedTimer<spvtools::utils::Timer>::ScopedTimer
              ((ScopedTimer<spvtools::utils::Timer> *)local_70,out,local_110,true);
    pPVar3 = std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::
             operator->((unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                         *)timer__LINE__.tag_);
    tools.impl_._M_t.
    super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
    .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ =
         Pass::Run(pPVar3,_auStack_20);
    if (tools.impl_._M_t.
        super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
        .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ == Failure) {
      tools.impl_._M_t.
      super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
      .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._0_4_ = 1;
      this_local._4_4_ = Failure;
    }
    else {
      if (tools.impl_._M_t.
          super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
          .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ ==
          SuccessWithChange) {
        print_disassembly.this._4_4_ = SuccessWithChange;
      }
      if ((this->validate_after_all_ & 1U) != 0) {
        SpirvTools::SpirvTools(&local_80,this->target_env_);
        pMVar4 = consumer(this);
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                  *)&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,pMVar4);
        SpirvTools::SetMessageConsumer
                  (&local_80,
                   (MessageConsumer *)
                   &binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        ~function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                   *)&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&msg.field_2 + 8));
        pMVar5 = IRContext::module(_auStack_20);
        Module::ToBinary(pMVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                ((long)&msg.field_2 + 8),true);
        binary_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               ((long)&msg.field_2 + 8));
        binary_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)&msg.field_2 + 8));
        bVar1 = SpirvTools::Validate(&local_80,binary_00,binary_size,this->val_options_);
        if (bVar1) {
          tools.impl_._M_t.
          super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
          .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._0_4_ = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_d8,"Validation failed after pass ",
                     (allocator<char> *)((long)&null_pos.index + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&null_pos.index + 7));
          pPVar3 = std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::
                   operator->((unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                               *)timer__LINE__.tag_);
          iVar2 = (*pPVar3->_vptr_Pass[2])();
          std::__cxx11::string::operator+=(local_d8,(char *)CONCAT44(extraout_var_00,iVar2));
          memset(local_f8,0,0x18);
          pMVar4 = consumer(this);
          __args_3 = (char *)std::__cxx11::string::c_str();
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(pMVar4,SPV_MSG_INTERNAL_ERROR,"",(spv_position_t *)local_f8,__args_3);
          this_local._4_4_ = Failure;
          tools.impl_._M_t.
          super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
          .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._0_4_ = 1;
          std::__cxx11::string::~string(local_d8);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&msg.field_2 + 8));
        SpirvTools::~SpirvTools(&local_80);
        if ((int)tools.impl_._M_t.
                 super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                 .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl != 0)
        goto LAB_00873022;
      }
      std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>::reset
                ((unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *)
                 timer__LINE__.tag_,(pointer)0x0);
      tools.impl_._M_t.
      super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
      .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._0_4_ = 0;
    }
LAB_00873022:
    utils::ScopedTimer<spvtools::utils::Timer>::~ScopedTimer
              ((ScopedTimer<spvtools::utils::Timer> *)local_70);
    if ((int)tools.impl_._M_t.
             super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
             .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl != 0) {
      return this_local._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Pass::Status PassManager::Run(IRContext* context) {
  auto status = Pass::Status::SuccessWithoutChange;

  // If print_all_stream_ is not null, prints the disassembly of the module
  // to that stream, with the given preamble and optionally the pass name.
  auto print_disassembly = [&context, this](const char* preamble, Pass* pass) {
    if (print_all_stream_) {
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, false);
      SpirvTools t(target_env_);
      t.SetMessageConsumer(consumer());
      std::string disassembly;
      std::string pass_name = (pass ? pass->name() : "");
      if (!t.Disassemble(binary, &disassembly)) {
        std::string msg = "Disassembly failed before pass ";
        msg += pass_name + "\n";
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_WARNING, "", null_pos, msg.c_str());
        return;
      }
      *print_all_stream_ << preamble << pass_name << "\n"
                         << disassembly << std::endl;
    }
  };

  SPIRV_TIMER_DESCRIPTION(time_report_stream_, /* measure_mem_usage = */ true);
  for (auto& pass : passes_) {
    print_disassembly("; IR before pass ", pass.get());
    SPIRV_TIMER_SCOPED(time_report_stream_, (pass ? pass->name() : ""), true);
    const auto one_status = pass->Run(context);
    if (one_status == Pass::Status::Failure) return one_status;
    if (one_status == Pass::Status::SuccessWithChange) status = one_status;

    if (validate_after_all_) {
      spvtools::SpirvTools tools(target_env_);
      tools.SetMessageConsumer(consumer());
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, true);
      if (!tools.Validate(binary.data(), binary.size(), val_options_)) {
        std::string msg = "Validation failed after pass ";
        msg += pass->name();
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_INTERNAL_ERROR, "", null_pos, msg.c_str());
        return Pass::Status::Failure;
      }
    }

    // Reset the pass to free any memory used by the pass.
    pass.reset(nullptr);
  }
  print_disassembly("; IR after last pass", nullptr);

  // Set the Id bound in the header in case a pass forgot to do so.
  //
  // TODO(dnovillo): This should be unnecessary and automatically maintained by
  // the IRContext.
  if (status == Pass::Status::SuccessWithChange) {
    context->module()->SetIdBound(context->module()->ComputeIdBound());
  }
  passes_.clear();
  return status;
}